

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  error_category *peVar2;
  bool bVar3;
  undefined1 *puVar4;
  error_code tec;
  path folders;
  file_status fs;
  iterator __begin2;
  string_type part;
  path current;
  iterator __end2;
  file_status local_160;
  error_category *peStack_158;
  undefined1 local_150 [16];
  path local_140;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  char *local_f0;
  char *local_e8;
  long local_e0;
  char local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  path local_a8;
  file_status local_88 [2];
  iterator local_78;
  
  local_a8._path._M_dataplus._M_p = (pointer)&local_a8._path.field_2;
  local_a8._path._M_string_length = 0;
  local_a8._path.field_2._M_local_buf[0] = '\0';
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  path::root_name_length(p);
  path::root_name_length(p);
  std::__cxx11::string::substr((ulong)&local_110,(ulong)p);
  path::operator=(&local_a8,(string_type *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_allocated_capacity != &local_100) {
    operator_delete((void *)local_110._M_allocated_capacity);
  }
  std::__cxx11::string::substr((ulong)&local_110,(ulong)p);
  local_140._path._M_dataplus._M_p = (pointer)&local_140._path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_allocated_capacity == &local_100) {
    local_140._path.field_2._8_8_ = local_100._8_8_;
  }
  else {
    local_140._path._M_dataplus._M_p = (pointer)local_110._M_allocated_capacity;
  }
  local_140._path._M_string_length = local_110._8_8_;
  local_110._8_8_ = 0;
  local_100._M_local_buf[0] = '\0';
  local_110._M_allocated_capacity = (size_type)&local_100;
  path::postprocess_path_with_format(&local_140,(format)p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_allocated_capacity != &local_100) {
    operator_delete((void *)local_110._M_allocated_capacity);
  }
  local_78._first._M_current = local_140._path._M_dataplus._M_p;
  path::iterator::iterator((iterator *)&local_110,&local_140,&local_78._first);
  local_160 = (file_status)
              ((long)local_140._path._M_dataplus._M_p + local_140._path._M_string_length);
  path::iterator::iterator(&local_78,&local_140,(const_iterator *)&local_160);
  bVar3 = false;
  do {
    if (local_f0 == local_78._iter._M_current) {
LAB_001af074:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2) {
        operator_delete(local_78._current._path._M_dataplus._M_p);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._path._M_dataplus._M_p != &local_140._path.field_2) {
        operator_delete(local_140._path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._path._M_dataplus._M_p != &local_a8._path.field_2) {
        operator_delete(local_a8._path._M_dataplus._M_p);
      }
      return bVar3;
    }
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_e8,local_e8 + local_e0);
    puVar4 = local_c8;
    local_160 = (file_status)local_150;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_160,local_c8,local_c8 + local_c0);
    path::postprocess_path_with_format((path *)&local_160,(format)puVar4);
    path::operator/=(&local_a8,(path *)&local_160);
    if (local_160 != (file_status)local_150) {
      operator_delete((void *)local_160);
    }
    local_160 = (file_status)((ulong)local_160 & 0xffffffff00000000);
    peStack_158 = peVar2;
    detail::status_ex((path *)local_120,(error_code *)&local_a8,&local_160,(uintmax_t *)0x0,
                      (uintmax_t *)0x0,(time_t *)0x0,0);
    if (local_160._type == none) {
      if ((uint)local_120._0_4_ < 2) goto LAB_001aefeb;
      bVar1 = true;
      if (local_120._0_4_ != 3) {
        ec->_M_value = 0x11;
        ec->_M_cat = peVar2;
        goto LAB_001af042;
      }
    }
    else if (local_120._0_4_ == 1) {
LAB_001aefeb:
      create_directory(&local_a8,ec);
      bVar1 = true;
      if (ec->_M_value != 0) {
        detail::status_ex((path *)(local_120 + 8),(error_code *)&local_a8,local_88,(uintmax_t *)0x0,
                          (uintmax_t *)0x0,(time_t *)0x0,0);
        if (local_120._8_4_ != 3) goto LAB_001af042;
        ec->_M_value = 0;
        ec->_M_cat = peVar2;
      }
      bVar3 = true;
    }
    else {
      ec->_M_value = local_160._type;
      *(perms *)&ec->field_0x4 = local_160._perms;
      *(undefined2 *)&ec->field_0x6 = local_160._6_2_;
      ec->_M_cat = peStack_158;
LAB_001af042:
      bVar1 = false;
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (!bVar1) {
      bVar3 = false;
      goto LAB_001af074;
    }
    path::iterator::operator++((iterator *)&local_110);
  } while( true );
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    auto rootPathLen = p._prefixLength + p.root_name_length() + (p.has_root_directory() ? 1 : 0);
    current = p.native().substr(0, rootPathLen);
    path folders(p._path.substr(rootPathLen));
    for (path::string_type part : folders) {
        current /= part;
        std::error_code tec;
        auto fs = status(current, tec);
        if (tec && fs.type() != file_type::not_found) {
            ec = tec;
            return false;
        }
        if (!exists(fs)) {
            create_directory(current, ec);
            if (ec) {
                std::error_code tmp_ec;
                if (is_directory(current, tmp_ec)) {
                    ec.clear();
                }
                else {
                    return false;
                }
            }
            didCreate = true;
        }
#ifndef LWG_2935_BEHAVIOUR
        else if (!is_directory(fs)) {
            ec = detail::make_error_code(detail::portable_error::exists);
            return false;
        }
#endif
    }
    return didCreate;
}